

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall dg::pta::PointerAnalysis::initialize_queue(PointerAnalysis *this)

{
  PointerSubgraph *this_00;
  long in_RDI;
  PSNode *root;
  uint in_stack_00000058;
  bool in_stack_0000005f;
  PSNode **in_stack_00000060;
  PointerGraph *in_stack_00000068;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffffd8;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffffe0;
  
  this_00 = PointerGraph::getEntry(*(PointerGraph **)(in_RDI + 0x38));
  PointerSubgraph::getRoot(this_00);
  PointerGraph::getNodes<dg::pta::PSNode*>
            (in_stack_00000068,in_stack_00000060,in_stack_0000005f,in_stack_00000058);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~vector
            (in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void initialize_queue() {
        assert(to_process.empty());

        PSNode *root = PG->getEntry()->getRoot();
        assert(root && "Do not have root of PG");
        // rely on C++11 move semantics
        to_process = PG->getNodes(root);
    }